

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

MacroUsageSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MacroUsageSyntax,slang::parsing::Token,slang::syntax::MacroActualArgumentListSyntax*>
          (BumpAllocator *this,Token *args,MacroActualArgumentListSyntax **args_1)

{
  MacroActualArgumentListSyntax *pMVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  MacroUsageSyntax *pMVar7;
  
  pMVar7 = (MacroUsageSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((MacroUsageSyntax *)this->endPtr < pMVar7 + 1) {
    pMVar7 = (MacroUsageSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pMVar7 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar2 = args->info;
  pMVar1 = *args_1;
  (pMVar7->super_DirectiveSyntax).super_SyntaxNode.kind = MacroUsage;
  (pMVar7->super_DirectiveSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pMVar7->super_DirectiveSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pMVar7->super_DirectiveSyntax).directive.kind = TVar3;
  (pMVar7->super_DirectiveSyntax).directive.field_0x2 = uVar4;
  (pMVar7->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)NVar5.raw;
  (pMVar7->super_DirectiveSyntax).directive.rawLen = uVar6;
  (pMVar7->super_DirectiveSyntax).directive.info = pIVar2;
  pMVar7->args = pMVar1;
  if (pMVar1 != (MacroActualArgumentListSyntax *)0x0) {
    (pMVar1->super_SyntaxNode).parent = (SyntaxNode *)pMVar7;
  }
  return pMVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }